

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testDeepScanLineBasic.cpp
# Opt level: O2

void anon_unknown.dwarf_e1e9c::generateRandomFile
               (string *filename,int channelCount,Compression compression,bool bulkWrite)

{
  PixelType PVar1;
  PixelType t;
  long lVar2;
  int iVar3;
  ostream *poVar4;
  ChannelList *pCVar5;
  void *pvVar6;
  uint uVar7;
  long lVar8;
  long lVar9;
  int k;
  size_t spst;
  undefined1 in_R10B;
  int j;
  long lVar10;
  int i_1;
  uint uVar11;
  ulong uVar12;
  uint l;
  long lVar13;
  ulong uVar14;
  int i;
  ulong uVar15;
  float fVar16;
  Array<Imf_2_5::Array2D<void_*>_> data;
  DeepScanLineOutputFile file;
  int type;
  DeepFrameBuffer frameBuffer;
  stringstream ss;
  undefined1 local_1e0 [376];
  DeepSlice local_68;
  
  std::operator<<((ostream *)&std::cout,"generating ");
  std::ostream::flush();
  frameBuffer._map._M_t._M_impl._0_8_ = 0;
  Imf_2_5::Header::Header
            ((Header *)&ss,(Box2i *)(anonymous_namespace)::displayWindow,
             (Box2i *)&(anonymous_namespace)::dataWindow,1.0,(V2f *)&frameBuffer,1.0,INCREASING_Y,
             compression);
  Imf_2_5::Header::operator=((Header *)(anonymous_namespace)::header,(Header *)&ss);
  Imf_2_5::Header::~Header((Header *)&ss);
  poVar4 = std::operator<<((ostream *)&std::cout,"compression ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,compression);
  std::operator<<(poVar4," ");
  std::ostream::flush();
  if (DAT_004233f8 != (anonymous_namespace)::channelTypes) {
    DAT_004233f8 = (anonymous_namespace)::channelTypes;
  }
  uVar11 = 0;
  uVar7 = 0;
  if (0 < channelCount) {
    uVar7 = channelCount;
  }
  for (; uVar7 != uVar11; uVar11 = uVar11 + 1) {
    type = random_int(3);
    std::__cxx11::stringstream::stringstream((stringstream *)&ss);
    std::ostream::operator<<(local_1e0,uVar11);
    std::__cxx11::stringbuf::str();
    if (type == 0) {
      pCVar5 = Imf_2_5::Header::channels((Header *)(anonymous_namespace)::header);
      Imf_2_5::Channel::Channel((Channel *)&local_68,UINT,1,1,false);
      Imf_2_5::ChannelList::insert(pCVar5,(string *)&frameBuffer,(Channel *)&local_68);
    }
    if (type == 1) {
      pCVar5 = Imf_2_5::Header::channels((Header *)(anonymous_namespace)::header);
      Imf_2_5::Channel::Channel((Channel *)&local_68,HALF,1,1,false);
      Imf_2_5::ChannelList::insert(pCVar5,(string *)&frameBuffer,(Channel *)&local_68);
    }
    if (type == 2) {
      pCVar5 = Imf_2_5::Header::channels((Header *)(anonymous_namespace)::header);
      Imf_2_5::Channel::Channel((Channel *)&local_68,FLOAT,1,1,false);
      Imf_2_5::ChannelList::insert(pCVar5,(string *)&frameBuffer,(Channel *)&local_68);
    }
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)&(anonymous_namespace)::channelTypes,&type);
    std::__cxx11::string::~string((string *)&frameBuffer);
    std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  }
  Imf_2_5::Header::setType
            ((Header *)(anonymous_namespace)::header,(string *)Imf_2_5::DEEPSCANLINE_abi_cxx11_);
  Imf_2_5::Array<Imf_2_5::Array2D<void_*>_>::Array(&data,(ulong)(uint)channelCount);
  uVar15 = (ulong)uVar7;
  for (lVar13 = 0; uVar15 * 0x18 - lVar13 != 0; lVar13 = lVar13 + 0x18) {
    Imf_2_5::Array2D<void_*>::resizeErase
              ((Array2D<void_*> *)((long)&(data._data)->_sizeX + lVar13),0xad,0x111);
  }
  Imf_2_5::Array2D<unsigned_int>::resizeErase
            ((Array2D<unsigned_int> *)(anonymous_namespace)::sampleCount,0xad,0x111);
  remove((filename->_M_dataplus)._M_p);
  Imf_2_5::DeepScanLineOutputFile::DeepScanLineOutputFile
            (&file,(filename->_M_dataplus)._M_p,(Header *)(anonymous_namespace)::header,8);
  Imf_2_5::DeepFrameBuffer::DeepFrameBuffer(&frameBuffer);
  Imf_2_5::Slice::Slice
            ((Slice *)&ss,UINT,
             (char *)((anonymous_namespace)::sampleCount._16_8_ +
                      (long)(anonymous_namespace)::dataWindow * -4 + (long)DAT_004233d4 * -0x444),4,
             0x444,1,1,0.0,(bool)in_R10B,(bool)((char)DAT_004233d4 * 'D'));
  Imf_2_5::DeepFrameBuffer::insertSampleCountSlice(&frameBuffer,(Slice *)&ss);
  lVar13 = 0x10;
  for (uVar12 = 0; uVar15 != uVar12; uVar12 = uVar12 + 1) {
    PVar1 = *(PixelType *)((anonymous_namespace)::channelTypes + uVar12 * 4);
    t = (uint)(PVar1 != UINT) * 3;
    if (PVar1 == HALF) {
      t = PVar1;
    }
    if (PVar1 == FLOAT) {
      t = PVar1;
    }
    std::__cxx11::stringstream::stringstream((stringstream *)&ss);
    std::ostream::operator<<(local_1e0,(int)uVar12);
    std::__cxx11::stringbuf::str();
    iVar3 = *(int *)((anonymous_namespace)::channelTypes + uVar12 * 4);
    spst = (ulong)(iVar3 == 0) << 2;
    if (iVar3 == 1) {
      spst = 2;
    }
    if (iVar3 == 2) {
      spst = 4;
    }
    Imf_2_5::DeepSlice::DeepSlice
              (&local_68,t,
               (char *)(*(long *)((long)&(data._data)->_sizeX + lVar13) +
                        (long)(anonymous_namespace)::dataWindow * -8 + (long)DAT_004233d4 * -0x888),
               8,0x888,spst,1,1,0.0,false,false);
    Imf_2_5::DeepFrameBuffer::insert(&frameBuffer,(string *)&type,&local_68);
    std::__cxx11::string::~string((string *)&type);
    std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
    lVar13 = lVar13 + 0x18;
  }
  Imf_2_5::DeepScanLineOutputFile::setFrameBuffer(&file,&frameBuffer);
  std::operator<<((ostream *)&std::cout,"writing ");
  std::ostream::flush();
  if (bulkWrite) {
    std::operator<<((ostream *)&std::cout,"bulk ");
    std::ostream::flush();
    for (lVar13 = 0; lVar13 != 0xad; lVar13 = lVar13 + 1) {
      for (lVar10 = 0; lVar10 != 0x111; lVar10 = lVar10 + 1) {
        iVar3 = random_int(10);
        lVar8 = (anonymous_namespace)::sampleCount._16_8_;
        lVar9 = (anonymous_namespace)::sampleCount._8_8_;
        *(int *)((anonymous_namespace)::sampleCount._16_8_ +
                 (anonymous_namespace)::sampleCount._8_8_ * lVar13 * 4 + lVar10 * 4) = iVar3 + 1;
        uVar7 = (uint)((int)lVar13 * 0x111 + (int)lVar10) % 0x801;
        fVar16 = (float)uVar7;
        for (uVar12 = 0; uVar12 != uVar15; uVar12 = uVar12 + 1) {
          iVar3 = *(int *)((anonymous_namespace)::channelTypes + uVar12 * 4);
          if (iVar3 == 0) {
            pvVar6 = operator_new__((ulong)*(uint *)(lVar8 + lVar9 * lVar13 * 4 + lVar10 * 4) << 2);
            data._data[uVar12]._data[data._data[uVar12]._sizeY * lVar13 + lVar10] = pvVar6;
            iVar3 = *(int *)((anonymous_namespace)::channelTypes + uVar12 * 4);
          }
          if (iVar3 == 1) {
            pvVar6 = operator_new__((ulong)*(uint *)(lVar9 * lVar13 * 4 +
                                                     (anonymous_namespace)::sampleCount._16_8_ +
                                                    lVar10 * 4) * 2);
            data._data[uVar12]._data[data._data[uVar12]._sizeY * lVar13 + lVar10] = pvVar6;
            iVar3 = *(int *)((anonymous_namespace)::channelTypes + uVar12 * 4);
          }
          if (iVar3 == 2) {
            pvVar6 = operator_new__((ulong)*(uint *)(lVar9 * lVar13 * 4 +
                                                     (anonymous_namespace)::sampleCount._16_8_ +
                                                    lVar10 * 4) << 2);
            data._data[uVar12]._data[data._data[uVar12]._sizeY * lVar13 + lVar10] = pvVar6;
          }
          lVar8 = 0;
          for (uVar14 = 0; lVar2 = (anonymous_namespace)::channelTypes,
              uVar14 < *(uint *)((anonymous_namespace)::sampleCount._16_8_ + lVar9 * lVar13 * 4 +
                                lVar10 * 4); uVar14 = uVar14 + 1) {
            iVar3 = *(int *)((anonymous_namespace)::channelTypes + uVar12 * 4);
            if (iVar3 == 0) {
              *(uint *)((long)data._data[uVar12]._data[data._data[uVar12]._sizeY * lVar13 + lVar10]
                       + lVar8 * 2) = uVar7;
              iVar3 = *(int *)(lVar2 + uVar12 * 4);
            }
            if (iVar3 == 1) {
              half::operator=((half *)((long)data._data[uVar12]._data
                                             [data._data[uVar12]._sizeY * lVar13 + lVar10] + lVar8),
                              fVar16);
              iVar3 = *(int *)((anonymous_namespace)::channelTypes + uVar12 * 4);
            }
            if (iVar3 == 2) {
              *(float *)((long)data._data[uVar12]._data[data._data[uVar12]._sizeY * lVar13 + lVar10]
                        + lVar8 * 2) = fVar16;
            }
            lVar8 = lVar8 + 2;
            lVar9 = (anonymous_namespace)::sampleCount._8_8_;
          }
          lVar8 = (anonymous_namespace)::sampleCount._16_8_;
        }
      }
    }
    Imf_2_5::DeepScanLineOutputFile::writePixels(&file,0xad);
  }
  else {
    std::operator<<((ostream *)&std::cout,"per-line ");
    std::ostream::flush();
    for (lVar13 = 0; lVar13 != 0xad; lVar13 = lVar13 + 1) {
      for (lVar10 = 0; lVar10 != 0x111; lVar10 = lVar10 + 1) {
        iVar3 = random_int(10);
        lVar8 = (anonymous_namespace)::sampleCount._16_8_;
        lVar9 = (anonymous_namespace)::sampleCount._8_8_;
        *(int *)((anonymous_namespace)::sampleCount._16_8_ +
                 (anonymous_namespace)::sampleCount._8_8_ * lVar13 * 4 + lVar10 * 4) = iVar3 + 1;
        uVar7 = (uint)((int)lVar13 * 0x111 + (int)lVar10) % 0x801;
        fVar16 = (float)uVar7;
        for (uVar12 = 0; uVar12 != uVar15; uVar12 = uVar12 + 1) {
          iVar3 = *(int *)((anonymous_namespace)::channelTypes + uVar12 * 4);
          if (iVar3 == 0) {
            pvVar6 = operator_new__((ulong)*(uint *)(lVar8 + lVar9 * lVar13 * 4 + lVar10 * 4) << 2);
            data._data[uVar12]._data[data._data[uVar12]._sizeY * lVar13 + lVar10] = pvVar6;
            iVar3 = *(int *)((anonymous_namespace)::channelTypes + uVar12 * 4);
          }
          if (iVar3 == 1) {
            pvVar6 = operator_new__((ulong)*(uint *)(lVar9 * lVar13 * 4 +
                                                     (anonymous_namespace)::sampleCount._16_8_ +
                                                    lVar10 * 4) * 2);
            data._data[uVar12]._data[data._data[uVar12]._sizeY * lVar13 + lVar10] = pvVar6;
            iVar3 = *(int *)((anonymous_namespace)::channelTypes + uVar12 * 4);
          }
          if (iVar3 == 2) {
            pvVar6 = operator_new__((ulong)*(uint *)(lVar9 * lVar13 * 4 +
                                                     (anonymous_namespace)::sampleCount._16_8_ +
                                                    lVar10 * 4) << 2);
            data._data[uVar12]._data[data._data[uVar12]._sizeY * lVar13 + lVar10] = pvVar6;
          }
          lVar8 = 0;
          for (uVar14 = 0; lVar2 = (anonymous_namespace)::channelTypes,
              uVar14 < *(uint *)((anonymous_namespace)::sampleCount._16_8_ + lVar9 * lVar13 * 4 +
                                lVar10 * 4); uVar14 = uVar14 + 1) {
            iVar3 = *(int *)((anonymous_namespace)::channelTypes + uVar12 * 4);
            if (iVar3 == 0) {
              *(uint *)((long)data._data[uVar12]._data[data._data[uVar12]._sizeY * lVar13 + lVar10]
                       + lVar8 * 2) = uVar7;
              iVar3 = *(int *)(lVar2 + uVar12 * 4);
            }
            if (iVar3 == 1) {
              half::operator=((half *)((long)data._data[uVar12]._data
                                             [data._data[uVar12]._sizeY * lVar13 + lVar10] + lVar8),
                              fVar16);
              iVar3 = *(int *)((anonymous_namespace)::channelTypes + uVar12 * 4);
            }
            if (iVar3 == 2) {
              *(float *)((long)data._data[uVar12]._data[data._data[uVar12]._sizeY * lVar13 + lVar10]
                        + lVar8 * 2) = fVar16;
            }
            lVar8 = lVar8 + 2;
            lVar9 = (anonymous_namespace)::sampleCount._8_8_;
          }
          lVar8 = (anonymous_namespace)::sampleCount._16_8_;
        }
      }
      Imf_2_5::DeepScanLineOutputFile::writePixels(&file,1);
    }
  }
  lVar13 = 0;
  do {
    if (lVar13 == 0xad) {
      std::
      _Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::DeepSlice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::DeepSlice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::DeepSlice>_>_>
      ::~_Rb_tree((_Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::DeepSlice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::DeepSlice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::DeepSlice>_>_>
                   *)&frameBuffer);
      Imf_2_5::DeepScanLineOutputFile::~DeepScanLineOutputFile(&file);
      Imf_2_5::Array<Imf_2_5::Array2D<void_*>_>::~Array(&data);
      return;
    }
    for (lVar10 = 0; lVar10 != 0x111; lVar10 = lVar10 + 1) {
      lVar9 = 4;
      for (uVar12 = 0; uVar15 != uVar12; uVar12 = uVar12 + 1) {
        iVar3 = *(int *)((anonymous_namespace)::channelTypes + uVar12 * 4);
        if (iVar3 == 0) {
          pvVar6 = *(void **)(*(long *)((long)data._data + lVar9 * 4 + -8) * lVar13 * 8 +
                              *(long *)((long)&(data._data)->_sizeX + lVar9 * 4) + lVar10 * 8);
          if (pvVar6 != (void *)0x0) {
            operator_delete__(pvVar6);
            iVar3 = *(int *)((anonymous_namespace)::channelTypes + uVar12 * 4);
            goto LAB_0013b742;
          }
        }
        else {
LAB_0013b742:
          if (iVar3 == 1) {
            pvVar6 = *(void **)(*(long *)((long)data._data + lVar9 * 4 + -8) * lVar13 * 8 +
                                *(long *)((long)&(data._data)->_sizeX + lVar9 * 4) + lVar10 * 8);
            if (pvVar6 == (void *)0x0) goto LAB_0013b79f;
            operator_delete__(pvVar6);
            iVar3 = *(int *)((anonymous_namespace)::channelTypes + uVar12 * 4);
          }
          if ((iVar3 == 2) &&
             (pvVar6 = *(void **)(*(long *)((long)data._data + lVar9 * 4 + -8) * lVar13 * 8 +
                                  *(long *)((long)&(data._data)->_sizeX + lVar9 * 4) + lVar10 * 8),
             pvVar6 != (void *)0x0)) {
            operator_delete__(pvVar6);
          }
        }
LAB_0013b79f:
        lVar9 = lVar9 + 6;
      }
    }
    lVar13 = lVar13 + 1;
  } while( true );
}

Assistant:

void generateRandomFile (const std::string filename,
                         int channelCount,
                         Compression compression,
                         bool bulkWrite)
{
    cout << "generating " << flush;
    header = Header(displayWindow, dataWindow,
                    1,
                    IMATH_NAMESPACE::V2f (0, 0),
                    1,
                    INCREASING_Y,
                    compression);

    cout << "compression " << compression << " " << flush;

    //
    // Add channels.
    //

    channelTypes.clear();

    for (int i = 0; i < channelCount; i++)
    {
        int type = random_int(3);
        stringstream ss;
        ss << i;
        string str = ss.str();
        if (type == 0)
            header.channels().insert(str, Channel(IMF::UINT));
        if (type == 1)
            header.channels().insert(str, Channel(IMF::HALF));
        if (type == 2)
            header.channels().insert(str, Channel(IMF::FLOAT));
        channelTypes.push_back(type);
    }

    header.setType(DEEPSCANLINE);

    Array<Array2D< void* > > data(channelCount);
    for (int i = 0; i < channelCount; i++)
        data[i].resizeErase(height, width);

    sampleCount.resizeErase(height, width);

    remove (filename.c_str());
    DeepScanLineOutputFile file(filename.c_str(), header, 8);

    DeepFrameBuffer frameBuffer;

    frameBuffer.insertSampleCountSlice (Slice (IMF::UINT,                    // type // 7
                                        (char *) (&sampleCount[0][0]
                                                  - dataWindow.min.x
                                                  - dataWindow.min.y * width),  // base
                                        sizeof (unsigned int) * 1,          // xStride
                                        sizeof (unsigned int) * width));    // yStride

    for (int i = 0; i < channelCount; i++)
    {
        PixelType type = NUM_PIXELTYPES;
        if (channelTypes[i] == 0)
            type = IMF::UINT;
        if (channelTypes[i] == 1)
            type = IMF::HALF;
        if (channelTypes[i] == 2)
            type = IMF::FLOAT;

        stringstream ss;
        ss << i;
        string str = ss.str();

        int sampleSize = 0;
        if (channelTypes[i] == 0) sampleSize = sizeof (unsigned int);
        if (channelTypes[i] == 1) sampleSize = sizeof (half);
        if (channelTypes[i] == 2) sampleSize = sizeof (float);

        int pointerSize = sizeof(char *);

        frameBuffer.insert (str,                            // name // 6
                            DeepSlice (type,                    // type // 7
                            (char *) (&data[i][0][0]
                                      - dataWindow.min.x
                                      - dataWindow.min.y * width),               // base // 8
                            pointerSize * 1,          // xStride// 9
                            pointerSize * width,      // yStride// 10
                            sampleSize));             // sampleStride
    }

    file.setFrameBuffer(frameBuffer);

    cout << "writing " << flush;
    if (bulkWrite)
    {
        cout << "bulk " << flush;
        for (int i = 0; i < height; i++)
        {
            //
            // Fill in data at the last minute.
            //

            for (int j = 0; j < width; j++)
            {
                sampleCount[i][j] = random_int(10) + 1;
                for (int k = 0; k < channelCount; k++)
                {
                    if (channelTypes[k] == 0)
                        data[k][i][j] = new unsigned int[sampleCount[i][j]];
                    if (channelTypes[k] == 1)
                        data[k][i][j] = new half[sampleCount[i][j]];
                    if (channelTypes[k] == 2)
                        data[k][i][j] = new float[sampleCount[i][j]];
                    for (unsigned int l = 0; l < sampleCount[i][j]; l++)
                    {
                        if (channelTypes[k] == 0)
                            ((unsigned int*)data[k][i][j])[l] = (i * width + j) % 2049;
                        if (channelTypes[k] == 1)
                            ((half*)data[k][i][j])[l] = (i * width + j) % 2049;
                        if (channelTypes[k] == 2)
                            ((float*)data[k][i][j])[l] = (i * width + j) % 2049;
                    }
                }
            }
        }

        file.writePixels(height);
    }
    else
    {
        cout << "per-line " << flush;
        for (int i = 0; i < height; i++)
        {
            //
            // Fill in data at the last minute.
            //

            for (int j = 0; j < width; j++)
            {
                sampleCount[i][j] = random_int(10) + 1;
                for (int k = 0; k < channelCount; k++)
                {
                    if (channelTypes[k] == 0)
                        data[k][i][j] = new unsigned int[sampleCount[i][j]];
                    if (channelTypes[k] == 1)
                        data[k][i][j] = new half[sampleCount[i][j]];
                    if (channelTypes[k] == 2)
                        data[k][i][j] = new float[sampleCount[i][j]];
                    for (unsigned int l = 0; l < sampleCount[i][j]; l++)
                    {
                        if (channelTypes[k] == 0)
                            ((unsigned int*)data[k][i][j])[l] = (i * width + j) % 2049;
                        if (channelTypes[k] == 1)
                            ((half*)data[k][i][j])[l] = (i * width + j) % 2049;
                        if (channelTypes[k] == 2)
                            ((float*)data[k][i][j])[l] = (i * width + j) % 2049;
                    }
                }
            }
            file.writePixels(1);
        }
    }

    for (int i = 0; i < height; i++)
        for (int j = 0; j < width; j++)
            for (int k = 0; k < channelCount; k++)
            {
                if (channelTypes[k] == 0)
                    delete[] (unsigned int*) data[k][i][j];
                if (channelTypes[k] == 1)
                    delete[] (half*) data[k][i][j];
                if (channelTypes[k] == 2)
                    delete[] (float*) data[k][i][j];
            }
}